

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# InertialParametersSolidShapesHelpers.cpp
# Opt level: O3

bool iDynTree::computeBoundingBoxFromShape(SolidShape *geom,Box *box)

{
  undefined8 uVar1;
  undefined8 uVar2;
  undefined8 uVar3;
  char cVar4;
  long lVar5;
  double dVar6;
  
  cVar4 = iDynTree::SolidShape::isBox();
  if (cVar4 == '\0') {
    cVar4 = iDynTree::SolidShape::isSphere();
    if (cVar4 == '\0') {
      cVar4 = iDynTree::SolidShape::isCylinder();
      if (cVar4 == '\0') {
        iDynTree::reportError
                  ("","computeBoundingBoxFromShape",
                   "IDYNTREE_USES_ASSIMP CMake option need to be set to ON to use computeBoundingBoxFromShape"
                  );
        return false;
      }
      iDynTree::SolidShape::asCylinder();
      dVar6 = (double)iDynTree::Cylinder::getRadius();
      iDynTree::Box::setX(dVar6 + dVar6);
      dVar6 = (double)iDynTree::Cylinder::getRadius();
      iDynTree::Box::setY(dVar6 + dVar6);
      dVar6 = (double)iDynTree::Cylinder::getLength();
    }
    else {
      iDynTree::SolidShape::asSphere();
      dVar6 = (double)iDynTree::Sphere::getRadius();
      iDynTree::Box::setX(dVar6 + dVar6);
      dVar6 = (double)iDynTree::Sphere::getRadius();
      iDynTree::Box::setY(dVar6 + dVar6);
      dVar6 = (double)iDynTree::Sphere::getRadius();
      dVar6 = dVar6 + dVar6;
    }
    iDynTree::Box::setZ(dVar6);
  }
  else {
    lVar5 = iDynTree::SolidShape::asBox();
    std::__cxx11::string::_M_assign((string *)(box + 8));
    box[0x28] = *(Box *)(lVar5 + 0x28);
    iDynTree::Transform::operator=((Transform *)(box + 0x30),(Transform *)(lVar5 + 0x30));
    uVar1 = *(undefined8 *)(lVar5 + 0x98);
    uVar2 = *(undefined8 *)(lVar5 + 0xa0);
    uVar3 = *(undefined8 *)(lVar5 + 0xa8);
    *(undefined8 *)(box + 0x90) = *(undefined8 *)(lVar5 + 0x90);
    *(undefined8 *)(box + 0x98) = uVar1;
    *(undefined8 *)(box + 0xa0) = uVar2;
    *(undefined8 *)(box + 0xa8) = uVar3;
    box[0xb0] = *(Box *)(lVar5 + 0xb0);
    uVar1 = *(undefined8 *)(lVar5 + 0xc0);
    uVar2 = *(undefined8 *)(lVar5 + 200);
    uVar3 = *(undefined8 *)(lVar5 + 0xd0);
    *(undefined8 *)(box + 0xb8) = *(undefined8 *)(lVar5 + 0xb8);
    *(undefined8 *)(box + 0xc0) = uVar1;
    *(undefined8 *)(box + 200) = uVar2;
    *(undefined8 *)(box + 0xd0) = uVar3;
    box[0xd8] = *(Box *)(lVar5 + 0xd8);
    std::__cxx11::string::_M_assign((string *)(box + 0xe0));
    std::__cxx11::string::_M_assign((string *)(box + 0x100));
    *(undefined8 *)(box + 0x130) = *(undefined8 *)(lVar5 + 0x130);
    uVar1 = *(undefined8 *)(lVar5 + 0x128);
    *(undefined8 *)(box + 0x120) = *(undefined8 *)(lVar5 + 0x120);
    *(undefined8 *)(box + 0x128) = uVar1;
  }
  iDynTree::SolidShape::getLink_H_geometry();
  iDynTree::SolidShape::setLink_H_geometry((Transform *)box);
  return true;
}

Assistant:

bool computeBoundingBoxFromShape(const SolidShape& geom, Box& box)
{
    // Extract BB from shape, this would be benefic from being moved as a method in the SolidShape interface
    if (geom.isBox())
    {
        // If shape is a box, just copy it
        Box* pBox = const_cast<Box*>(geom.asBox());
        box = *pBox;
        box.setLink_H_geometry(geom.getLink_H_geometry());
        return true;
    }

    if (geom.isSphere())
    {
        // If shape is a sphere all the side of the BB are the diameter of the sphere
        Sphere* pSphere = const_cast<Sphere *>(geom.asSphere());
        box.setX(2.0*pSphere->getRadius());
        box.setY(2.0*pSphere->getRadius());
        box.setZ(2.0*pSphere->getRadius());
        box.setLink_H_geometry(geom.getLink_H_geometry());
        return true;
    }

    if (geom.isCylinder())
    {
        // If shape is a cylinder the x and y side of the BB are the diameter of the cylinder,
        // while the z side is the lenght of the cylinder
        Cylinder* pCylinder = const_cast<Cylinder *>(geom.asCylinder());
        box.setX(2.0*pCylinder->getRadius());
        box.setY(2.0*pCylinder->getRadius());
        box.setZ(pCylinder->getLength());
        box.setLink_H_geometry(geom.getLink_H_geometry());
        return true;
    }
    
#ifdef IDYNTREE_USES_ASSIMP
    if (geom.isExternalMesh())
    {
        // If shape is an external mesh, we need to load the mesh and extract the BB
        ExternalMesh* pExtMesh = const_cast<ExternalMesh *>(geom.asExternalMesh());
        return BBFromExternalShape(pExtMesh, box);
    }    
#else
    reportError("", "computeBoundingBoxFromShape", "IDYNTREE_USES_ASSIMP CMake option need to be set to ON to use computeBoundingBoxFromShape");
#endif
    return false;
    
}